

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

CFeeRate __thiscall
CBlockPolicyEstimator::estimateRawFee
          (CBlockPolicyEstimator *this,int confTarget,double successThreshold,
          FeeEstimateHorizon horizon,EstimationResult *result)

{
  TxConfirmStats *this_00;
  longlong lVar1;
  long in_FS_OFFSET;
  double dVar2;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  unique_lock<std::mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (LONG_HALFLIFE < horizon) {
LAB_00280ada:
    __assert_fail("stats",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
                  ,0x2e6,
                  "CFeeRate CBlockPolicyEstimator::estimateRawFee(int, double, FeeEstimateHorizon, EstimationResult *) const"
                 );
  }
  this_00 = *(TxConfirmStats **)
             ((long)&(this->super_CValidationInterface)._vptr_CValidationInterface +
             *(long *)(&DAT_0081d958 + (ulong)horizon * 8));
  if (this_00 == (TxConfirmStats *)0x0) goto LAB_00280ada;
  dVar2 = *(double *)(&DAT_0081d940 + (ulong)horizon * 8);
  local_40._M_device = &(this->m_cs_fee_estimator).super_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  if (0 < confTarget) {
    lVar1 = 0;
    if ((1.0 < successThreshold) ||
       ((int)((ulong)((long)(this_00->confAvg).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this_00->confAvg).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) * this_00->scale *
        -0x55555555 < (uint)confTarget)) goto LAB_00280ab0;
    dVar2 = TxConfirmStats::EstimateMedianVal
                      (this_00,confTarget,dVar2,successThreshold,this->nBestSeenHeight,result);
    if (0.0 <= dVar2) {
      lVar1 = llround(dVar2);
      goto LAB_00280ab0;
    }
  }
  lVar1 = 0;
LAB_00280ab0:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (CFeeRate)lVar1;
  }
  __stack_chk_fail();
}

Assistant:

CFeeRate CBlockPolicyEstimator::estimateRawFee(int confTarget, double successThreshold, FeeEstimateHorizon horizon, EstimationResult* result) const
{
    TxConfirmStats* stats = nullptr;
    double sufficientTxs = SUFFICIENT_FEETXS;
    switch (horizon) {
    case FeeEstimateHorizon::SHORT_HALFLIFE: {
        stats = shortStats.get();
        sufficientTxs = SUFFICIENT_TXS_SHORT;
        break;
    }
    case FeeEstimateHorizon::MED_HALFLIFE: {
        stats = feeStats.get();
        break;
    }
    case FeeEstimateHorizon::LONG_HALFLIFE: {
        stats = longStats.get();
        break;
    }
    } // no default case, so the compiler can warn about missing cases
    assert(stats);

    LOCK(m_cs_fee_estimator);
    // Return failure if trying to analyze a target we're not tracking
    if (confTarget <= 0 || (unsigned int)confTarget > stats->GetMaxConfirms())
        return CFeeRate(0);
    if (successThreshold > 1)
        return CFeeRate(0);

    double median = stats->EstimateMedianVal(confTarget, sufficientTxs, successThreshold, nBestSeenHeight, result);

    if (median < 0)
        return CFeeRate(0);

    return CFeeRate(llround(median));
}